

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O3

void h2v1_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                    JSAMPARRAY output_data)

{
  JSAMPROW pJVar1;
  JSAMPROW pJVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  
  iVar7 = compptr->DCT_h_scaled_size * compptr->width_in_blocks;
  uVar4 = (ulong)cinfo->max_v_samp_factor;
  if (0 < (long)uVar4) {
    uVar5 = cinfo->image_width;
    if (0 < (int)(iVar7 * 2 - uVar5)) {
      uVar8 = 0;
      do {
        memset(input_data[uVar8] + uVar5,(uint)input_data[uVar8][(ulong)uVar5 - 1],
               (ulong)(iVar7 * 2 + ~uVar5) + 1);
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
      uVar4 = (ulong)(uint)cinfo->max_v_samp_factor;
    }
  }
  if (0 < (int)uVar4) {
    lVar6 = 0;
    do {
      if (iVar7 != 0) {
        pJVar1 = input_data[lVar6];
        pJVar2 = output_data[lVar6];
        lVar3 = 0;
        uVar5 = 0;
        do {
          pJVar2[lVar3] = (JSAMPLE)(pJVar1[lVar3 * 2] + uVar5 + (uint)pJVar1[lVar3 * 2 + 1] >> 1);
          uVar5 = uVar5 ^ 1;
          lVar3 = lVar3 + 1;
        } while (iVar7 != (int)lVar3);
        uVar4 = (ulong)(uint)cinfo->max_v_samp_factor;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)uVar4);
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_downsample (j_compress_ptr cinfo, jpeg_component_info * compptr,
		 JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int inrow;
  JDIMENSION outcol;
  JDIMENSION output_cols = compptr->width_in_blocks * compptr->DCT_h_scaled_size;
  register JSAMPROW inptr, outptr;
  register int bias;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor,
		    cinfo->image_width, output_cols * 2);

  for (inrow = 0; inrow < cinfo->max_v_samp_factor; inrow++) {
    outptr = output_data[inrow];
    inptr = input_data[inrow];
    bias = 0;			/* bias = 0,1,0,1,... for successive samples */
    for (outcol = 0; outcol < output_cols; outcol++) {
      *outptr++ = (JSAMPLE) ((GETJSAMPLE(*inptr) + GETJSAMPLE(inptr[1])
			      + bias) >> 1);
      bias ^= 1;		/* 0=>1, 1=>0 */
      inptr += 2;
    }
  }
}